

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzer.cpp
# Opt level: O2

bool isParamValid(char *p,uint64_t *value)

{
  size_t sVar1;
  ostream *poVar2;
  __integer_from_chars_result_type<unsigned_long> _Var3;
  
  sVar1 = strlen(p);
  _Var3 = std::from_chars<unsigned_long>(p,p + sVar1,value,10);
  if (_Var3.ec != 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Error: wrong parameter type: ");
    poVar2 = std::operator<<(poVar2,p);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return _Var3.ec == 0;
}

Assistant:

static bool isParamValid(char const* p, uint64_t& value) {
  auto result = std::from_chars(p, p + strlen(p), value);
  if (result.ec != std::errc()) {
    std::cerr << "Error: wrong parameter type: " << p << std::endl;
    return false;
  }
  return true;
}